

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_thread_result ma_device_job_thread_entry(void *pUserData)

{
  ma_result mVar1;
  ma_job job;
  anon_union_8_2_cf9b0fbd_for_toc local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pJobThread != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x6fa1,"ma_thread_result ma_device_job_thread_entry(void *)");
  }
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88.allocation = 0;
  uStack_80 = 0;
  local_28 = 0;
  mVar1 = ma_job_queue_next((ma_job_queue *)((long)pUserData + 8),(ma_job *)&local_88.breakup);
  if (local_88.breakup.code != 0 && mVar1 == MA_SUCCESS) {
    do {
      if (local_88.breakup.code < 0xd) {
        (*(code *)(&g_jobVTable)[local_88.breakup.code])(&local_88);
      }
      local_38 = 0;
      uStack_30 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88.allocation = 0;
      uStack_80 = 0;
      local_28 = 0;
      mVar1 = ma_job_queue_next((ma_job_queue *)((long)pUserData + 8),(ma_job *)&local_88.breakup);
    } while ((mVar1 == MA_SUCCESS) && (local_88.breakup.code != 0));
  }
  return (ma_thread_result)0x0;
}

Assistant:

static ma_thread_result MA_THREADCALL ma_device_job_thread_entry(void* pUserData)
{
    ma_device_job_thread* pJobThread = (ma_device_job_thread*)pUserData;
    MA_ASSERT(pJobThread != NULL);

    for (;;) {
        ma_result result;
        ma_job job;

        result = ma_device_job_thread_next(pJobThread, &job);
        if (result != MA_SUCCESS) {
            break;
        }

        if (job.toc.breakup.code == MA_JOB_TYPE_QUIT) {
            break;
        }

        ma_job_process(&job);
    }

    return (ma_thread_result)0;
}